

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::ConsoleReporter::getDashes_abi_cxx11_(void)

{
  int iVar1;
  
  if (getDashes[abi:cxx11]()::dashes_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getDashes[abi:cxx11]()::dashes_abi_cxx11_);
    if (iVar1 != 0) {
      getDashes[abi:cxx11]()::dashes_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getDashes[abi:cxx11]()::dashes_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct(0x1674a0,'O');
      __cxa_atexit(std::__cxx11::string::~string,&getDashes[abi:cxx11]()::dashes_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getDashes[abi:cxx11]()::dashes_abi_cxx11_);
    }
  }
  return &getDashes[abi:cxx11]()::dashes_abi_cxx11_;
}

Assistant:

static std::string const& getDashes() {
            static const std::string dashes( CATCH_CONFIG_CONSOLE_WIDTH-1, '-' );
            return dashes;
        }